

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Remove(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  VMValue *pVVar5;
  char *pcVar6;
  PClassActor *filter;
  bool bVar7;
  FName local_34;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e27da;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e27be:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e27da:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b6,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003e26d8;
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e27da;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003e27be;
LAB_003e26d8:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_003e2802:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b7,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e2802;
  }
  if (numparam < 3) {
    pVVar5 = defaultparam->Array;
    if (pVVar5[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e2849;
    }
    iVar2 = pVVar5[2].field_0.i;
LAB_003e271f:
    if (pVVar5[3].field_0.field_3.Type != '\x03') {
LAB_003e27c7:
      pcVar6 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e2868:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b9,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    filter = (PClassActor *)pVVar5[3].field_0.field_1.a;
    if (pVVar5[3].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003e27c7;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003e2849:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b8,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[2].field_0.i;
    if (numparam == 3) {
      pVVar5 = defaultparam->Array;
      goto LAB_003e271f;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[3].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar6 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e2868;
    }
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e2821;
      }
      goto LAB_003e2788;
    }
    pVVar5 = defaultparam->Array;
  }
  if (pVVar5[4].field_0.field_3.Type != '\0') {
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e2821:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18ba,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003e2788:
  pAVar4 = COPY_AAPTR(pAVar4,param[1].field_0.i);
  if (pAVar4 != (AActor *)0x0) {
    DoRemove(pAVar4,iVar2,filter,&local_34);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Remove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(removee);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	AActor *reference = COPY_AAPTR(self, removee);
	if (reference != NULL)
	{
		DoRemove(reference, flags, filter, species);
	}
	return 0;
}